

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::MapEntryMessageComparator::operator()
          (MapEntryMessageComparator *this,Message *a,Message *b)

{
  FieldDescriptor *field;
  bool bVar1;
  bool bVar2;
  int32_t iVar3;
  int32_t iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  int64_t iVar8;
  int64_t iVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  Reflection *this_00;
  size_type __n;
  ulong uVar12;
  Metadata MVar13;
  string_view str;
  string first;
  string second;
  string local_68;
  string local_48;
  
  MVar13 = Message::GetMetadata(a);
  this_00 = MVar13.reflection;
  field = this->field_;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    iVar3 = Reflection::GetInt32(this_00,a,field);
    iVar4 = Reflection::GetInt32(this_00,b,this->field_);
    bVar1 = SBORROW4(iVar3,iVar4);
    bVar2 = iVar3 - iVar4 < 0;
    goto LAB_002bbae4;
  case 2:
    iVar8 = Reflection::GetInt64(this_00,a,field);
    iVar9 = Reflection::GetInt64(this_00,b,this->field_);
    bVar1 = SBORROW8(iVar8,iVar9);
    bVar2 = iVar8 - iVar9 < 0;
LAB_002bbae4:
    bVar2 = bVar1 != bVar2;
    break;
  case 3:
    uVar5 = Reflection::GetUInt32(this_00,a,field);
    uVar6 = Reflection::GetUInt32(this_00,b,this->field_);
    bVar2 = uVar5 < uVar6;
    break;
  case 4:
    uVar10 = Reflection::GetUInt64(this_00,a,field);
    uVar11 = Reflection::GetUInt64(this_00,b,this->field_);
    bVar2 = uVar10 < uVar11;
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x994);
    str._M_str = "Invalid key for map field.";
    str._M_len = 0x1a;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_68,str);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_68);
    bVar2 = true;
    break;
  case 7:
    bVar1 = Reflection::GetBool(this_00,a,field);
    bVar2 = Reflection::GetBool(this_00,b,this->field_);
    bVar2 = !bVar1 && bVar2;
    break;
  case 9:
    Reflection::GetString_abi_cxx11_(&local_68,this_00,a,field);
    Reflection::GetString_abi_cxx11_(&local_48,this_00,b,this->field_);
    __n = local_68._M_string_length;
    if (local_48._M_string_length < local_68._M_string_length) {
      __n = local_48._M_string_length;
    }
    if (__n == 0) {
LAB_002bbb98:
      uVar12 = 0xffffffff80000000;
      if (-0x80000000 < (long)(local_68._M_string_length - local_48._M_string_length)) {
        uVar12 = local_68._M_string_length - local_48._M_string_length;
      }
      if (0x7ffffffe < (long)uVar12) {
        uVar12 = 0;
      }
    }
    else {
      uVar7 = memcmp(local_68._M_dataplus._M_p,local_48._M_dataplus._M_p,__n);
      uVar12 = (ulong)uVar7;
      if (uVar7 == 0) goto LAB_002bbb98;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    bVar2 = (bool)((byte)(uVar12 >> 0x1f) & 1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar2;
}

Assistant:

bool operator()(const Message* a, const Message* b) {
    const Reflection* reflection = a->GetReflection();
    switch (field_->cpp_type()) {
      case FieldDescriptor::CPPTYPE_BOOL: {
        bool first = reflection->GetBool(*a, field_);
        bool second = reflection->GetBool(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_INT32: {
        int32_t first = reflection->GetInt32(*a, field_);
        int32_t second = reflection->GetInt32(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_INT64: {
        int64_t first = reflection->GetInt64(*a, field_);
        int64_t second = reflection->GetInt64(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_UINT32: {
        uint32_t first = reflection->GetUInt32(*a, field_);
        uint32_t second = reflection->GetUInt32(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64_t first = reflection->GetUInt64(*a, field_);
        uint64_t second = reflection->GetUInt64(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_STRING: {
        std::string first = reflection->GetString(*a, field_);
        std::string second = reflection->GetString(*b, field_);
        return first < second;
      }
      default:
        ABSL_DLOG(FATAL) << "Invalid key for map field.";
        return true;
    }
  }